

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

double __thiscall Emitter::findFlowRate(Emitter *this,double h,double *dqdh)

{
  double dVar1;
  double local_20;
  
  *dqdh = 0.0;
  dVar1 = 0.0;
  if (0.0 < h) {
    local_20 = this->flowCoeff;
    if (this->timePattern != (Pattern *)0x0) {
      dVar1 = Pattern::currentFactor(this->timePattern);
      local_20 = local_20 * dVar1;
    }
    dVar1 = pow(h,this->expon);
    dVar1 = dVar1 * local_20;
    *dqdh = (this->expon * dVar1) / h;
  }
  return dVar1;
}

Assistant:

double Emitter::findFlowRate(double h, double& dqdh)
{
    dqdh = 0.0;
    if ( h <= 0.0 ) return 0.0;
    double a = flowCoeff;
    if (timePattern) a *= timePattern->currentFactor();
    double q = a * pow(h, expon);
    dqdh = expon * q / h;
    return q;
}